

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peglib.h
# Opt level: O2

void __thiscall peg::Capture::Capture(Capture *this,shared_ptr<peg::Ope> *ope,MatchAction *ma)

{
  (this->super_Ope)._vptr_Ope = (_func_int **)&PTR__Capture_0016a020;
  std::__shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->ope_).super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>,
             &ope->super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>);
  std::function<void_(const_char_*,_unsigned_long,_peg::Context_&)>::function
            (&this->match_action_,ma);
  return;
}

Assistant:

Capture(const std::shared_ptr<Ope> &ope, MatchAction ma)
      : ope_(ope), match_action_(ma) {}